

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::SparseTextureAllocationTestCase::positiveTesting
          (SparseTextureAllocationTestCase *this,Functions *gl,GLint target,GLint format)

{
  bool bVar1;
  GLenum GVar2;
  GLint GVar3;
  GLint pageSizeY;
  GLint pageSizeX;
  GLuint texture;
  GLint pageSizeZ;
  GLuint local_38;
  GLuint local_34;
  GLuint local_30;
  int local_2c;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Positive Testing - ",0x13);
  gl4cts::Texture::Generate(gl,&local_30);
  (*gl->bindTexture)(target,local_30);
  GVar2 = (*gl->getError)();
  glu::checkError(GVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xb5);
  GVar3 = SparseTextureUtils::getTargetDepth(target);
  SparseTextureUtils::getTexturePageSizes
            (gl,target,format,(GLint *)&local_34,(GLint *)&local_38,&local_2c);
  (*gl->texParameteri)(target,0x91a6,1);
  GVar2 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError(&this->mLog,"texParameteri",GVar2,0);
  if (bVar1) {
    if ((target == 0x9009) || (target == 0x8513)) {
      if ((int)local_38 < (int)local_34) {
        local_38 = local_34;
      }
      else if ((int)local_34 < (int)local_38) {
        local_34 = local_38;
      }
    }
    gl4cts::Texture::Storage(gl,target,1,format,local_34,local_38,GVar3 * local_2c);
    GVar2 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError(&this->mLog,"Texture::Storage",GVar2,0);
    (*gl->deleteTextures)(1,&local_30);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xd4);
  }
  else {
    (*gl->deleteTextures)(1,&local_30);
    GVar2 = (*gl->getError)();
    glu::checkError(GVar2,"GenTextures",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0xd4);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SparseTextureAllocationTestCase::positiveTesting(const Functions& gl, GLint target, GLint format)
{
	mLog << "Positive Testing - ";

	GLuint texture;

	Texture::Generate(gl, texture);
	Texture::Bind(gl, texture, target);

	GLint pageSizeX;
	GLint pageSizeY;
	GLint pageSizeZ;
	GLint depth = SparseTextureUtils::getTargetDepth(target);
	SparseTextureUtils::getTexturePageSizes(gl, target, format, pageSizeX, pageSizeY, pageSizeZ);

	gl.texParameteri(target, GL_TEXTURE_SPARSE_ARB, GL_TRUE);
	if (!SparseTextureUtils::verifyError(mLog, "texParameteri", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	//The <width> and <height> has to be equal for cube map textures
	if (target == GL_TEXTURE_CUBE_MAP || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		if (pageSizeX > pageSizeY)
			pageSizeY = pageSizeX;
		else if (pageSizeX < pageSizeY)
			pageSizeX = pageSizeY;
	}

	Texture::Storage(gl, target, 1, format, pageSizeX, pageSizeY, depth * pageSizeZ);
	if (!SparseTextureUtils::verifyError(mLog, "Texture::Storage", gl.getError(), GL_NO_ERROR))
	{
		Texture::Delete(gl, texture);
		return false;
	}

	Texture::Delete(gl, texture);
	return true;
}